

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.cc
# Opt level: O0

int __thiscall tvm::runtime::GraphRuntime::GetInputIndex(GraphRuntime *this,string *name)

{
  ulong uVar1;
  __type _Var2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  LogMessage local_48;
  uint local_2c;
  ulong uStack_28;
  uint32_t nid;
  size_t i;
  string *name_local;
  GraphRuntime *this_local;
  
  uStack_28 = 0;
  i = (size_t)name;
  name_local = (string *)this;
  while( true ) {
    uVar1 = uStack_28;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->input_nodes_);
    if (sVar3 <= uVar1) {
      dmlc::LogMessage::LogMessage
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                 ,0x5b);
      poVar6 = dmlc::LogMessage::stream(&local_48);
      poVar6 = std::operator<<(poVar6,"Warning: cannot find \"");
      poVar6 = std::operator<<(poVar6,(string *)i);
      std::operator<<(poVar6,"\" among input");
      dmlc::LogMessage::~LogMessage(&local_48);
      return -1;
    }
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->input_nodes_,uStack_28);
    local_2c = *pvVar4;
    pvVar5 = std::
             vector<tvm::runtime::GraphRuntime::Node,_std::allocator<tvm::runtime::GraphRuntime::Node>_>
             ::operator[](&this->nodes_,(ulong)local_2c);
    _Var2 = std::operator==(&pvVar5->name,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)i);
    if (_Var2) break;
    uStack_28 = uStack_28 + 1;
  }
  return (int)uStack_28;
}

Assistant:

int GraphRuntime::GetInputIndex(const std::string &name) {
  for (size_t i = 0; i < input_nodes_.size(); ++i) {
    uint32_t nid = input_nodes_[i];
    if (nodes_[nid].name == name) {
      return static_cast<int>(i);
    }
  }
  LOG(WARNING) << "Warning: cannot find \"" << name << "\" among input";
  return -1;
}